

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

KeyInfo * sqlite3KeyInfoAlloc(sqlite3 *db,int N,int X)

{
  KeyInfo *pKVar1;
  int iVar2;
  size_t __n;
  
  iVar2 = X + N;
  __n = (size_t)(iVar2 * 9 + -8);
  pKVar1 = (KeyInfo *)sqlite3DbMallocRawNN(db,__n + 0x28);
  if (pKVar1 == (KeyInfo *)0x0) {
    if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
      db->mallocFailed = '\x01';
      if (0 < db->nVdbeExec) {
        (db->u1).isInterrupted = 1;
      }
      (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    }
  }
  else {
    pKVar1->aSortOrder = (u8 *)(pKVar1->aColl + iVar2);
    pKVar1->nKeyField = (u16)N;
    pKVar1->nAllField = (u16)iVar2;
    pKVar1->enc = db->enc;
    pKVar1->db = db;
    pKVar1->nRef = 1;
    memset(pKVar1 + 1,0,__n);
  }
  return pKVar1;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoAlloc(sqlite3 *db, int N, int X){
  int nExtra = (N+X)*(sizeof(CollSeq*)+1) - sizeof(CollSeq*);
  KeyInfo *p = sqlite3DbMallocRawNN(db, sizeof(KeyInfo) + nExtra);
  if( p ){
    p->aSortOrder = (u8*)&p->aColl[N+X];
    p->nKeyField = (u16)N;
    p->nAllField = (u16)(N+X);
    p->enc = ENC(db);
    p->db = db;
    p->nRef = 1;
    memset(&p[1], 0, nExtra);
  }else{
    sqlite3OomFault(db);
  }
  return p;
}